

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_meta___newindex(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  CType *ct;
  CTState *cts;
  CTInfo qual;
  uint8_t *p;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  qual = 0;
  pTVar1 = L->base;
  if ((pTVar1 + 2 < L->top) && ((pTVar1->field_2).it == 0xfffffff5)) {
    ct = lj_cdata_index(cts,(GCcdata *)(ulong)(pTVar1->u32).lo,pTVar1 + 1,&p,&qual);
    if ((qual & 1) == 0) {
      lj_cdata_set(cts,ct,p,pTVar1 + 2,qual);
      iVar2 = 0;
    }
    else {
      if ((qual >> 0x19 & 1) != 0) {
        lj_err_caller(L,LJ_ERR_FFI_WRCONST);
      }
      iVar2 = ffi_index_meta(L,cts,ct,MM_newindex);
    }
    return iVar2;
  }
  lj_err_argt(L,1,10);
}

Assistant:

LJLIB_CF(ffi_meta___newindex)	LJLIB_REC(cdata_index 1)
{
  CTState *cts = ctype_cts(L);
  CTInfo qual = 0;
  CType *ct;
  uint8_t *p;
  TValue *o = L->base;
  if (!(o+2 < L->top && tviscdata(o)))  /* Also checks for key and value. */
    lj_err_argt(L, 1, LUA_TCDATA);
  ct = lj_cdata_index(cts, cdataV(o), o+1, &p, &qual);
  if ((qual & 1)) {
    if ((qual & CTF_CONST))
      lj_err_caller(L, LJ_ERR_FFI_WRCONST);
    return ffi_index_meta(L, cts, ct, MM_newindex);
  }
  lj_cdata_set(cts, ct, p, o+2, qual);
  return 0;
}